

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_codecvt.h
# Opt level: O0

code_point
booster::locale::utf8_codecvt<wchar_t>::from_unicode
          (state_type *param_1,code_point u,char *begin,char *end)

{
  bool bVar1;
  long in_RCX;
  char *in_RDX;
  code_point in_ESI;
  int width;
  undefined4 local_4;
  
  bVar1 = utf::is_valid_codepoint(in_ESI);
  if (bVar1) {
    local_4 = utf::utf_traits<char,_1>::width(in_ESI);
    if (in_RCX - (long)in_RDX < (long)(int)local_4) {
      local_4 = 0xfffffffe;
    }
    else {
      utf::utf_traits<char,1>::encode<char*>(in_ESI,in_RDX);
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

static utf::code_point from_unicode(state_type &,utf::code_point u,char *begin,char const *end) 
    {
        if(!utf::is_valid_codepoint(u))
            return utf::illegal;
        int width;
        if((width=utf::utf_traits<char>::width(u)) > end - begin)
            return utf::incomplete;
        utf::utf_traits<char>::encode(u,begin);
        return width;
    }